

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O2

void __thiscall pass_bundle_to_struct_Test::TestBody(pass_bundle_to_struct_Test *this)

{
  undefined8 uVar1;
  Generator *this_00;
  Generator *this_01;
  Port *pPVar2;
  Port *var;
  Generator *top;
  undefined1 local_420 [8];
  Context c;
  PortBundleDefinition def;
  string local_220;
  undefined1 local_200 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e8;
  shared_ptr<kratos::Stmt> local_1e0;
  undefined1 local_1d0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b8;
  shared_ptr<kratos::Stmt> local_1b0;
  undefined1 local_1a0 [16];
  shared_ptr<kratos::Stmt> local_190;
  undefined1 local_180 [16];
  shared_ptr<kratos::Stmt> local_170;
  undefined1 local_160 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  undefined1 local_130 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_128 [10];
  undefined1 local_80 [24];
  undefined1 local_68 [32];
  undefined1 local_48 [23];
  allocator<char> local_31;
  
  kratos::Context::Context((Context *)local_420);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"bundle",(allocator<char> *)local_130);
  kratos::PortBundleDefinition::PortBundleDefinition
            ((PortBundleDefinition *)&c.tracked_generators_._M_h._M_single_bucket,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"a",(allocator<char> *)local_68);
  kratos::PortBundleDefinition::add_definition
            ((PortBundleDefinition *)&c.tracked_generators_._M_h._M_single_bucket,
             (string *)local_130,1,1,false,In,Data);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"b",(allocator<char> *)local_68);
  kratos::PortBundleDefinition::add_definition
            ((PortBundleDefinition *)&c.tracked_generators_._M_h._M_single_bucket,
             (string *)local_130,1,1,false,In,Data);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"module1",(allocator<char> *)local_68);
  this_00 = kratos::Context::generator((Context *)local_420,(string *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"module2",(allocator<char> *)local_68);
  this_01 = kratos::Context::generator((Context *)local_420,(string *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"module3",(allocator<char> *)local_68);
  local_80._16_8_ = kratos::Context::generator((Context *)local_420,(string *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)local_68);
  kratos::Generator::add_bundle_port_def
            ((Generator *)local_200,(string *)this_01,(PortBundleDefinition *)local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"a",(allocator<char> *)local_68);
  pPVar2 = kratos::Generator::port(this_01,Out,(string *)local_130,1);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"b",(allocator<char> *)local_68);
  local_148._8_8_ = kratos::Generator::port(this_01,Out,(string *)local_130,1);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)this_01);
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"a",&local_31);
  kratos::PortBundleRef::get_port((PortBundleRef *)uVar1,(string *)local_68);
  kratos::Var::assign((Var *)local_80,&pPVar2->super_Var);
  local_200._16_8_ = local_80._0_8_;
  _Stack_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
  local_80._0_8_ = (element_type *)0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_01,(shared_ptr<kratos::Stmt> *)(local_200 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)this_01);
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"b",&local_31);
  kratos::PortBundleRef::get_port((PortBundleRef *)uVar1,(string *)local_68);
  kratos::Var::assign((Var *)local_80,(Var *)local_148._8_8_);
  local_1e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80._0_8_;
  local_1e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
  local_80._0_8_ = (_Base_ptr)0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_01,&local_1e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"mod2",(allocator<char> *)local_80);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_68,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_01->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_00,(string *)local_130,(shared_ptr<kratos::Generator> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"p",(allocator<char> *)local_80);
  kratos::PortBundleDefinition::flip
            ((PortBundleDefinition *)local_130,
             (PortBundleDefinition *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::add_bundle_port_def
            ((Generator *)local_1d0,(string *)local_80._16_8_,(PortBundleDefinition *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
  kratos::PortBundleDefinition::~PortBundleDefinition((PortBundleDefinition *)local_130);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"a",(allocator<char> *)local_68);
  pPVar2 = kratos::Generator::port((Generator *)local_80._16_8_,In,(string *)local_130,1);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"b",(allocator<char> *)local_68);
  local_138._M_p =
       (pointer)kratos::Generator::port((Generator *)local_80._16_8_,In,(string *)local_130,1);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)local_80._16_8_);
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"a",&local_31);
  var = kratos::PortBundleRef::get_port((PortBundleRef *)uVar1,(string *)local_68);
  kratos::Var::assign((Var *)local_80,&var->super_Var);
  local_1d0._16_8_ = local_80._0_8_;
  _Stack_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
  local_80._0_8_ = (element_type *)0x0;
  local_80._8_8_ = (pointer)0x0;
  local_160._16_8_ = pPVar2;
  kratos::Generator::add_stmt
            ((Generator *)local_80._16_8_,(shared_ptr<kratos::Stmt> *)(local_1d0 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)local_80._16_8_);
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"b",&local_31);
  pPVar2 = kratos::PortBundleRef::get_port((PortBundleRef *)uVar1,(string *)local_68);
  kratos::Var::assign((Var *)local_80,&pPVar2->super_Var);
  local_1b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80._0_8_;
  local_1b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
  local_80._0_8_ = (element_type *)0x0;
  local_80._8_8_ = (element_type *)0x0;
  kratos::Generator::add_stmt((Generator *)local_80._16_8_,&local_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"mod3",(allocator<char> *)local_80);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_68,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)(local_80._16_8_ + 0x68));
  kratos::Generator::add_child_generator
            (this_00,(string *)local_130,(shared_ptr<kratos::Generator> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"a",(allocator<char> *)local_68);
  kratos::Generator::port(this_00,In,(string *)local_130,1);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"b",(allocator<char> *)local_68);
  local_148._M_allocated_capacity =
       (size_type)kratos::Generator::port(this_00,Out,(string *)local_130,1);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)this_01);
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"a",&local_31);
  pPVar2 = kratos::PortBundleRef::get_port((PortBundleRef *)uVar1,(string *)local_68);
  kratos::Var::assign((Var *)local_80,&pPVar2->super_Var);
  local_1a0._0_8_ = local_80._0_8_;
  local_1a0._8_8_ = local_80._8_8_;
  local_80._0_8_ = (_Base_ptr)0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)this_01);
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"b",&local_31);
  pPVar2 = kratos::PortBundleRef::get_port((PortBundleRef *)uVar1,(string *)local_68);
  kratos::Var::assign((Var *)local_80,&pPVar2->super_Var);
  local_190.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80._0_8_;
  local_190.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
  local_80._0_8_ = (_Base_ptr)0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_00,&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_190.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  kratos::Var::assign((Var *)local_130,(Var *)local_160._16_8_);
  local_180._0_8_ = local_130;
  local_180._8_8_ = aaStack_128[0]._0_8_;
  local_130 = (undefined1  [8])0x0;
  aaStack_128[0]._0_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130 + 8));
  kratos::Var::assign((Var *)local_130,(Var *)local_138._M_p);
  local_170.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_130;
  local_170.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aaStack_128[0]._0_8_;
  local_130 = (undefined1  [8])0x0;
  aaStack_128[0]._0_8_ = 0;
  kratos::Generator::add_stmt(this_00,&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_170.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"p",(allocator<char> *)(local_48 + 0x16));
  kratos::Generator::get_bundle_ref((Generator *)local_48,(string *)local_80._16_8_);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"b",&local_31);
  pPVar2 = kratos::PortBundleRef::get_port((PortBundleRef *)local_48._0_8_,(string *)local_68);
  kratos::Var::operator+(&pPVar2->super_Var,(Var *)local_148._8_8_);
  kratos::Var::assign((Var *)local_80,(Var *)local_148._M_allocated_capacity);
  local_160._0_8_ = local_80._0_8_;
  local_160._8_8_ = local_80._8_8_;
  local_80._0_8_ = (_Base_ptr)0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_130);
  kratos::fix_assignment_type(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::change_port_bundle_struct(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::decouple_generator_ports(this_00);
  kratos::create_module_instantiation(this_00);
  kratos::remove_fanout_one_wires(this_00);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count,(kratos *)this_00,
             top);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  kratos::PortBundleDefinition::~PortBundleDefinition
            ((PortBundleDefinition *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Context::~Context((Context *)local_420);
  return;
}

Assistant:

TEST(pass, bundle_to_struct) {  // NOLINT
    Context c;
    auto def = PortBundleDefinition("bundle");
    def.add_definition("a", 1, 1, false, PortDirection::In, PortType::Data);
    def.add_definition("b", 1, 1, false, PortDirection::In, PortType::Data);
    auto &mod1 = c.generator("module1");
    auto &mod2 = c.generator("module2");
    auto &mod3 = c.generator("module3");

    // mod2 definition
    mod2.add_bundle_port_def("p", def);
    auto &port2_a = mod2.port(PortDirection::Out, "a", 1);
    auto &port2_b = mod2.port(PortDirection::Out, "b", 1);
    mod2.add_stmt(port2_a.assign(mod2.get_bundle_ref("p")->get_port("a")));
    mod2.add_stmt(port2_b.assign(mod2.get_bundle_ref("p")->get_port("b")));
    mod1.add_child_generator("mod2", mod2.shared_from_this());

    // mod3 definition
    mod3.add_bundle_port_def("p", def.flip());
    auto &port3_a = mod3.port(PortDirection::In, "a", 1);
    auto &port3_b = mod3.port(PortDirection::In, "b", 1);
    mod3.add_stmt(mod3.get_bundle_ref("p")->get_port("a").assign(port3_a));
    mod3.add_stmt(mod3.get_bundle_ref("p")->get_port("b").assign(port3_b));
    mod1.add_child_generator("mod3", mod3.shared_from_this());

    // mod1 definition
    auto &mod1_a = mod1.port(PortDirection::In, "a", 1);
    auto &mod1_b = mod1.port(PortDirection::Out, "b", 1);
    mod1.add_stmt(mod2.get_bundle_ref("p")->get_port("a").assign(mod1_a));
    mod1.add_stmt(mod2.get_bundle_ref("p")->get_port("b").assign(mod1_a));
    mod1.add_stmt(port3_a.assign(mod1_a));
    mod1.add_stmt(port3_b.assign(mod1_a));
    mod1.add_stmt(mod1_b.assign(mod3.get_bundle_ref("p")->get_port("b") + port2_b));

    // run bundle to pack pass
    fix_assignment_type(&mod1);
    verify_generator_connectivity(&mod1);
    // remove_pass_through_modules(&mod1);
    change_port_bundle_struct(&mod1);
    verify_generator_connectivity(&mod1);
    decouple_generator_ports(&mod1);
    create_module_instantiation(&mod1);
    remove_fanout_one_wires(&mod1);
    generate_verilog(&mod1);
}